

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::ArraySpliceHelper<int>
               (JavascriptArray *pnewArr,JavascriptArray *pArr,uint32 start,uint32 deleteLen,
               Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext)

{
  Type *addr;
  uint uVar1;
  Recycler *recycler;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  SparseArraySegment<int> *pSVar6;
  SparseArraySegmentBase *pSVar7;
  SparseArraySegmentBase *pSVar8;
  Type *pTVar9;
  uint uVar10;
  uint uVar11;
  uint32 uVar12;
  Type TVar13;
  ulong uVar14;
  Type *local_80;
  Type *local_68;
  SparseArraySegmentBase *local_58;
  Type *local_48;
  
  recycler = scriptContext->recycler;
  addr = &pArr->head;
  pSVar8 = (pArr->head).ptr;
  if (pSVar8 == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1c5f,"(pArr->head)","pArr->head");
    if (!bVar3) goto LAB_00b938d0;
    *puVar5 = 0;
    pSVar8 = addr->ptr;
  }
  if (pSVar8 == EmptySegment) {
    AllocateHead<int>(pArr);
    pSVar8 = (pArr->head).ptr;
  }
  uVar11 = pSVar8->left + pSVar8->size;
  if (CARRY4(pSVar8->left,pSVar8->size)) {
    uVar11 = 0xffffffff;
  }
  local_48 = addr;
  if (start < uVar11) {
    local_58 = (SparseArraySegmentBase *)0x0;
    local_80 = addr;
  }
  else {
    do {
      local_58 = pSVar8;
      local_80 = local_48;
      local_48 = &local_58->next;
      pSVar8 = (local_58->next).ptr;
      if (pSVar8 == (SparseArraySegmentBase *)0x0) {
        IsInlineSegment((SparseArraySegmentBase *)0x0,pArr);
        goto LAB_00b931b2;
      }
      uVar11 = pSVar8->left + pSVar8->size;
      if (CARRY4(pSVar8->left,pSVar8->size)) {
        uVar11 = 0xffffffff;
      }
    } while (uVar11 <= start);
  }
  uVar10 = deleteLen + start;
  bVar3 = IsInlineSegment(pSVar8,pArr);
  uVar11 = pSVar8->left;
  if ((uVar11 <= start) && (uVar10 <= pSVar8->length + uVar11)) {
    pSVar7 = (pSVar8->next).ptr;
    ArraySegmentSpliceHelper<int>
              (pnewArr,(SparseArraySegment<int> *)pSVar8,(Type *)local_48,start,deleteLen,insertArgs
               ,insertLen,recycler);
    if (pSVar7 != (SparseArraySegmentBase *)0x0) {
      do {
        pSVar7->left = pSVar7->left + (insertLen - deleteLen);
        pSVar8 = (pSVar7->next).ptr;
        if (pSVar8 == (SparseArraySegmentBase *)0x0) {
          SparseArraySegmentBase::EnsureSizeInBound(pSVar7);
          pSVar8 = (pSVar7->next).ptr;
        }
        pSVar7 = pSVar8;
      } while (pSVar8 != (SparseArraySegmentBase *)0x0);
    }
    if (local_48->ptr == (SparseArraySegmentBase *)0x0) {
      return;
    }
    SparseArraySegmentBase::EnsureSizeInBound(local_48->ptr);
    return;
  }
  local_68 = &pnewArr->head;
  if (uVar11 < start) {
    uVar11 = uVar11 + pSVar8->length;
    uVar12 = uVar11 - start;
    if (start <= uVar11 && uVar12 != 0) {
      if (((pSVar8->next).ptr != (SparseArraySegmentBase *)0x0) ||
         (bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase), bVar3)) {
        pSVar6 = SparseArraySegment<int>::AllocateSegmentImpl<false>
                           (recycler,0,uVar12,uVar12,(SparseArraySegmentBase *)0x0);
      }
      else {
        pSVar6 = SparseArraySegment<int>::AllocateSegmentImpl<true>
                           (recycler,0,uVar12,uVar12,(SparseArraySegmentBase *)0x0);
      }
      pSVar7 = &SparseArraySegment<int>::CopySegment
                          (recycler,pSVar6,0,(SparseArraySegment<int> *)pSVar8,start,uVar12)->
                super_SparseArraySegmentBase;
      (pSVar7->next).ptr = (SparseArraySegmentBase *)0x0;
      Memory::Recycler::WBSetBit((char *)local_68);
      local_68->ptr = pSVar7;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
      SparseArraySegment<int>::Truncate((SparseArraySegment<int> *)pSVar8,start);
      local_68 = &pSVar7->next;
    }
    pTVar9 = &pSVar8->next;
    local_80 = local_48;
    local_58 = pSVar8;
  }
  else {
    if (!bVar3) goto LAB_00b9313b;
    if (start < uVar11) goto LAB_00b9313b;
    uVar1 = pSVar8->length + uVar11;
    uVar12 = uVar1 - start;
    pTVar9 = local_48;
    if (uVar1 < start || uVar12 == 0) {
      if (uVar11 != 0 || pSVar8->length != 0) goto LAB_00b9313b;
      if (pSVar8->size == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1cda,"(startSeg->size != 0)","startSeg->size != 0");
        if (!bVar3) goto LAB_00b938d0;
        *puVar5 = 0;
      }
      pSVar7 = (pSVar8->next).ptr;
      Memory::Recycler::WBSetBit((char *)local_48);
      local_48->ptr = pSVar7;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_48);
    }
    else {
      if ((pSVar8->next).ptr == (SparseArraySegmentBase *)0x0) {
        pSVar6 = SparseArraySegment<int>::AllocateSegment
                           (recycler,0,uVar12,uVar12,(SparseArraySegmentBase *)0x0);
      }
      else {
        pSVar6 = SparseArraySegment<int>::AllocateSegmentImpl<false>
                           (recycler,0,uVar12,uVar12,(SparseArraySegmentBase *)0x0);
      }
      pSVar7 = &SparseArraySegment<int>::CopySegment
                          (recycler,pSVar6,0,(SparseArraySegment<int> *)pSVar8,start,uVar12)->
                super_SparseArraySegmentBase;
      Memory::Recycler::WBSetBit((char *)local_68);
      local_68->ptr = pSVar7;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
      local_68 = &pSVar7->next;
      pSVar7 = (pSVar8->next).ptr;
      Memory::Recycler::WBSetBit((char *)local_48);
      local_48->ptr = pSVar7;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_48);
      (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(pArr,pSVar8,0);
    }
  }
  pSVar8 = (pSVar8->next).ptr;
  local_48 = pTVar9;
  while (pSVar8 != (SparseArraySegmentBase *)0x0) {
LAB_00b9313b:
    TVar13 = pSVar8->left;
    if (uVar10 < pSVar8->length + TVar13) {
      bVar3 = false;
      if (local_58 != (SparseArraySegmentBase *)0x0) goto LAB_00b93320;
      pTVar9 = local_48;
      if (TVar13 != 0) goto LAB_00b93206;
      TVar13 = 0;
      local_58 = (SparseArraySegmentBase *)0x0;
      goto LAB_00b93320;
    }
    pTVar9 = &pSVar8->next;
    pSVar7 = (pSVar8->next).ptr;
    pSVar8->left = TVar13 - start;
    (pSVar8->next).ptr = (SparseArraySegmentBase *)0x0;
    Memory::Recycler::WBSetBit((char *)local_68);
    local_68->ptr = pSVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
    Memory::Recycler::WBSetBit((char *)local_48);
    local_48->ptr = pSVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_48);
    pSVar8 = pSVar7;
    local_68 = pTVar9;
  }
  if (local_58 == (SparseArraySegmentBase *)0x0) {
    bVar3 = true;
    pSVar8 = (SparseArraySegmentBase *)0x0;
    pTVar9 = local_48;
LAB_00b93206:
    local_80 = pTVar9;
    if (addr->ptr != pSVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf6,"(pArr->head == startSeg)","pArr->head == startSeg");
      if (!bVar4) goto LAB_00b938d0;
      *puVar5 = 0;
    }
    EnsureHeadStartsFromZero<int>(pArr,recycler);
    local_58 = (pArr->head).ptr;
    if ((local_58 == (SparseArraySegmentBase *)0x0) || ((local_58->next).ptr != pSVar8)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf8,"(pArr->head && pArr->head->next == startSeg)",
                                  "pArr->head && pArr->head->next == startSeg");
      if (!bVar4) goto LAB_00b938d0;
      *puVar5 = 0;
      local_58 = addr->ptr;
    }
    local_48 = &local_58->next;
    if (bVar3) {
      if (pSVar8 != (SparseArraySegmentBase *)0x0) goto LAB_00b934f4;
    }
    else {
      TVar13 = pSVar8->left;
      bVar3 = true;
LAB_00b93320:
      uVar11 = uVar10 - TVar13;
      if (TVar13 <= uVar10 && uVar11 != 0) {
        bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase);
        if (bVar4) {
          pSVar6 = SparseArraySegment<int>::AllocateSegmentImpl<false>
                             (recycler,TVar13 - start,uVar11,(SparseArraySegmentBase *)0x0);
        }
        else {
          pSVar6 = SparseArraySegment<int>::AllocateSegmentImpl<true>
                             (recycler,TVar13 - start,uVar11,(SparseArraySegmentBase *)0x0);
        }
        pSVar7 = &SparseArraySegment<int>::CopySegment
                            (recycler,pSVar6,pSVar8->left - start,(SparseArraySegment<int> *)pSVar8,
                             pSVar8->left,uVar11)->super_SparseArraySegmentBase;
        (pSVar7->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::Recycler::WBSetBit((char *)local_68);
        local_68->ptr = pSVar7;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(local_68);
        uVar14 = (ulong)(pSVar8->length - uVar11);
        memmove_xplat(pSVar8 + 1,&pSVar8[1].left + uVar11,uVar14 * 4);
        if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_015bf41c) == 1) {
          (*g_verifyIsNotBarrierAddress)(pSVar8 + 1,uVar14);
        }
        pSVar8->left = pSVar8->left + uVar11;
        pSVar8->length = pSVar8->length - uVar11;
        SparseArraySegmentBase::CheckLengthvsSize(pSVar8);
        SparseArraySegment<int>::Truncate
                  ((SparseArraySegment<int> *)pSVar8,pSVar8->length + pSVar8->left);
        SparseArraySegmentBase::EnsureSizeInBound(pSVar8);
        TVar13 = pSVar8->left;
      }
      if (bVar3 && (TVar13 - deleteLen) + insertLen == 0) {
        if (TVar13 - deleteLen != start) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1d17,"(start + insertLen == 0)","start + insertLen == 0");
          if (!bVar3) goto LAB_00b938d0;
          *puVar5 = 0;
        }
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pSVar8;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        local_58 = (SparseArraySegmentBase *)0x0;
        local_48 = addr;
      }
LAB_00b934f4:
      do {
        pSVar8->left = pSVar8->left + (insertLen - deleteLen);
        pSVar7 = (pSVar8->next).ptr;
        if (pSVar7 == (SparseArraySegmentBase *)0x0) {
          SparseArraySegmentBase::EnsureSizeInBound(pSVar8);
          pSVar7 = (pSVar8->next).ptr;
        }
        pSVar8 = pSVar7;
      } while (pSVar7 != (SparseArraySegmentBase *)0x0);
    }
    SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
    if (local_58 != (SparseArraySegmentBase *)0x0) goto LAB_00b9353e;
    bVar3 = true;
    local_58 = (SparseArraySegmentBase *)0x0;
  }
  else {
LAB_00b931b2:
    SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
LAB_00b9353e:
    SparseArraySegmentBase::EnsureSizeInBound(local_58);
    bVar3 = false;
  }
  if (insertLen == 0) {
    return;
  }
  bVar4 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
  if ((bVar4) || (bVar4 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr), bVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1d34,
                                "(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr))"
                                ,
                                "!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr)"
                               );
    if (!bVar4) goto LAB_00b938d0;
    *puVar5 = 0;
  }
  if (!bVar3) {
    uVar11 = local_58->left;
    if (start < uVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d3a,"(!savePrev || savePrev->left <= start)",
                                  "!savePrev || savePrev->left <= start");
      if (!bVar3) {
LAB_00b938d0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      uVar11 = local_58->left;
    }
    uVar10 = local_58->size - (start - uVar11);
    if (start - uVar11 <= local_58->size && uVar10 != 0) {
      uVar12 = insertLen - uVar10;
      pSVar8 = local_58;
      if (uVar10 <= insertLen && uVar12 != 0) {
        bVar3 = IsInlineSegment(local_58,pArr);
        pSVar8 = (local_58->next).ptr;
        if (pSVar8 == (SparseArraySegmentBase *)0x0) {
          pSVar8 = &SparseArraySegment<int>::GrowByMin
                              ((SparseArraySegment<int> *)local_58,recycler,uVar12)->
                    super_SparseArraySegmentBase;
        }
        else {
          pSVar8 = &SparseArraySegment<int>::GrowByMinMax
                              ((SparseArraySegment<int> *)local_58,recycler,uVar12,
                               pSVar8->left - (local_58->left + local_58->size))->
                    super_SparseArraySegmentBase;
        }
        if (bVar3) {
          (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (pArr,local_58,0);
        }
      }
      Memory::Recycler::WBSetBit((char *)local_80);
      local_80->ptr = pSVar8;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_80);
      pSVar8->length = (start + insertLen) - pSVar8->left;
      SparseArraySegmentBase::CheckLengthvsSize(pSVar8);
      goto LAB_00b9379f;
    }
  }
  pSVar8 = local_48->ptr;
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase);
  if ((pSVar8 != (SparseArraySegmentBase *)0x0) || (bVar3)) {
    pSVar8 = &SparseArraySegment<int>::AllocateSegmentImpl<false>(recycler,start,insertLen,pSVar8)->
              super_SparseArraySegmentBase;
  }
  else {
    pSVar8 = &SparseArraySegment<int>::AllocateSegmentImpl<true>
                        (recycler,start,insertLen,(SparseArraySegmentBase *)0x0)->
              super_SparseArraySegmentBase;
  }
  pSVar7 = local_48->ptr;
  Memory::Recycler::WBSetBit((char *)&pSVar8->next);
  (pSVar8->next).ptr = pSVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar8->next);
  Memory::Recycler::WBSetBit((char *)local_48);
  local_48->ptr = pSVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_48);
LAB_00b9379f:
  Memory::CopyArray<int,int,Memory::Recycler>
            ((int *)(&pSVar8[1].left + (start - pSVar8->left)),(ulong)insertLen,(int *)insertArgs,
             (ulong)insertLen);
  return;
}

Assistant:

void JavascriptArray::ArraySpliceHelper(JavascriptArray* pnewArr, JavascriptArray* pArr, uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext)
    {
        // Skip pnewArr->EnsureHead(): we don't use existing segment at all.
        Recycler *recycler  = scriptContext->GetRecycler();

        Field(SparseArraySegmentBase*)* prevSeg  = &pArr->head;        // holds the next pointer of previous
        Field(SparseArraySegmentBase*)* prevPrevSeg  = &pArr->head;    // this holds the previous pointer to prevSeg dirty trick.
        SparseArraySegmentBase* savePrev = nullptr;

        Assert(pArr->head); // We should never have a null head.
        pArr->EnsureHead<T>();
        SparseArraySegment<T>* startSeg = SparseArraySegment<T>::From(pArr->head);

        const uint32 limit = start + deleteLen;
        uint32 rightLimit;
        if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
        {
            rightLimit = JavascriptArray::MaxArrayLength;
        }

        // Find out the segment to start delete
        while (startSeg && (rightLimit <= start))
        {
            savePrev = startSeg;
            prevPrevSeg = prevSeg;
            prevSeg = &startSeg->next;
            startSeg = SparseArraySegment<T>::From(startSeg->next);

            if (startSeg)
            {
                if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
                {
                    rightLimit = JavascriptArray::MaxArrayLength;
                }
            }
        }

        bool hasInlineSegment = JavascriptArray::IsInlineSegment(startSeg, pArr);
        if (startSeg)
        {
            // Delete Phase
            if (startSeg->left <= start && (startSeg->left + startSeg->length) >= limit)
            {
                // All splice happens in one segment.
                SparseArraySegmentBase *nextSeg = startSeg->next;
                // Splice the segment first, which might OOM throw but the array would be intact.
                JavascriptArray::ArraySegmentSpliceHelper(
                    pnewArr, startSeg, SparseArraySegment<T>::AddressFrom(prevSeg),
                    start, deleteLen, insertArgs, insertLen, recycler);
                while (nextSeg)
                {
                    // adjust next segments left
                    nextSeg->left = nextSeg->left - deleteLen + insertLen;
                    if (nextSeg->next == nullptr)
                    {
                        nextSeg->EnsureSizeInBound();
                    }
                    nextSeg = nextSeg->next;
                }
                if (*prevSeg)
                {
                    (*prevSeg)->EnsureSizeInBound();
                }
                return;
            }
            else
            {
                SparseArraySegment<T>* newHeadSeg = nullptr; // pnewArr->head is null
                Field(SparseArraySegmentBase*)* prevNewHeadSeg = &pnewArr->head;

                // delete till deleteLen and reuse segments for new array if it is possible.
                // 3 steps -
                //1. delete 1st segment (which may be partial delete)
                // 2. delete next n complete segments
                // 3. delete last segment (which again may be partial delete)

                // Step (1)  -- WOOB 1116297: When left >= start, step (1) is skipped, resulting in pNewArr->head->left != 0. We need to touch up pNewArr.
                if (startSeg->left < start)
                {
                    if (start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;

                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        newHeadSeg->next = nullptr;
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;
                        startSeg->Truncate(start);
                    }
                    savePrev = startSeg;
                    prevPrevSeg = prevSeg;
                    prevSeg = &startSeg->next;
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }

                // Step (2) first we should do a hard copy if we have an inline head Segment
                else if (hasInlineSegment && nullptr != startSeg)
                {
                    // start should be in between left and left + length
                    if (startSeg->left  <= start && start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;
                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;

                        // Remove the entire segment from the original array
                        *prevSeg = startSeg->next;
                        pArr->ClearElements(startSeg, 0);
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                    // if we have an inline head segment with 0 elements, remove it
                    else if (startSeg->left == 0 && startSeg->length == 0)
                    {
                        Assert(startSeg->size != 0);
                        *prevSeg = startSeg->next;
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                }
                // Step (2) proper
                SparseArraySegmentBase *temp = nullptr;
                while (startSeg && (startSeg->left + startSeg->length) <= limit)
                {
                    temp = startSeg->next;

                    // move that entire segment to new array
                    startSeg->left = startSeg->left - start;
                    startSeg->next = nullptr;
                    *prevNewHeadSeg = startSeg;
                    prevNewHeadSeg = &startSeg->next;

                    // Remove the entire segment from the original array
                    *prevSeg = temp;
                    startSeg = (SparseArraySegment<T>*)temp;
                }

                // Step(2) above could delete the original head segment entirely, causing current head not
                // starting from 0. Then if any of the following throw, we have a corrupted array. Need
                // protection here.
                bool dummyHeadNodeInserted = false;
                if (!savePrev && (!startSeg || startSeg->left != 0))
                {
                    Assert(pArr->head == startSeg);
                    pArr->EnsureHeadStartsFromZero<T>(recycler);
                    Assert(pArr->head && pArr->head->next == startSeg);

                    savePrev = pArr->head;
                    prevPrevSeg = prevSeg;
                    prevSeg = &pArr->head->next;
                    dummyHeadNodeInserted = true;
                }

                // Step (3)
                if (startSeg && (startSeg->left < limit))
                {
                    // copy the first part of the last segment to be deleted to new array
                    uint32 headDeleteLen = start + deleteLen - startSeg->left ;

                    newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, startSeg->left -  start, headDeleteLen, (SparseArraySegmentBase *)nullptr);
                    newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, startSeg->left -  start, startSeg, startSeg->left, headDeleteLen);
                    newHeadSeg->next = nullptr;
                    *prevNewHeadSeg = newHeadSeg;
                    prevNewHeadSeg = &newHeadSeg->next;

                    // move the last segment
                    MoveArray(startSeg->elements, startSeg->elements + headDeleteLen, startSeg->length - headDeleteLen);
                    startSeg->left = startSeg->left + headDeleteLen; // We are moving the left ahead to point to the right index
                    startSeg->length = startSeg->length - headDeleteLen;
                    startSeg->CheckLengthvsSize();
                    startSeg->Truncate(startSeg->left + startSeg->length);
                    startSeg->EnsureSizeInBound(); // Just truncated, size might exceed next.left
                }

                if (startSeg && ((startSeg->left - deleteLen + insertLen) == 0) && dummyHeadNodeInserted)
                {
                    Assert(start + insertLen == 0);
                    // Remove the dummy head node to preserve array consistency.
                    pArr->head = startSeg;
                    savePrev = nullptr;
                    prevSeg = &pArr->head;
                }

                while (startSeg)
                {
                    startSeg->left = startSeg->left - deleteLen + insertLen ;
                    if (startSeg->next == nullptr)
                    {
                        startSeg->EnsureSizeInBound();
                    }
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }
            }
        }

        // The size of pnewArr head allocated in above step 1 might exceed next.left concatenated in step 2/3.
        pnewArr->head->EnsureSizeInBound();
        if (savePrev)
        {
            savePrev->EnsureSizeInBound();
        }

        // insert elements
        if (insertLen > 0)
        {
            Assert(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr));

            // InsertPhase
            SparseArraySegment<T> *segInsert = nullptr;

            // see if we are just about the right of the previous segment
            Assert(!savePrev || savePrev->left <= start);
            if (savePrev && (start - savePrev->left < savePrev->size))
            {
                segInsert = (SparseArraySegment<T>*)savePrev;
                uint32 spaceLeft = segInsert->size - (start - segInsert->left);
                if(spaceLeft < insertLen)
                {
                    SparseArraySegment<T> *oldSegInsert = segInsert;
                    bool isInlineSegment = JavascriptArray::IsInlineSegment(segInsert, pArr);
                    if (!segInsert->next)
                    {
                        segInsert = segInsert->GrowByMin(recycler, insertLen - spaceLeft);
                    }
                    else
                    {
                        segInsert = segInsert->GrowByMinMax(recycler, insertLen - spaceLeft, segInsert->next->left - segInsert->left - segInsert->size);
                    }

                    if (isInlineSegment)
                    {
                        pArr->ClearElements(oldSegInsert, 0);
                    }
                }
                *prevPrevSeg = segInsert;
                segInsert->length = start + insertLen - segInsert->left;
                segInsert->CheckLengthvsSize();
            }
            else
            {
                segInsert = SparseArraySegment<T>::AllocateSegment(recycler, start, insertLen, *prevSeg);
                segInsert->next = *prevSeg;
                *prevSeg = segInsert;
                savePrev = segInsert;
            }

            uint32 relativeStart = start - segInsert->left;
            // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
            CopyArray(segInsert->elements + relativeStart, insertLen,
                      reinterpret_cast<const T*>(insertArgs), insertLen);
        }
    }